

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

TRexBool trex_matchcclass(int cclass,char c)

{
  ushort **ppuVar1;
  uint uStack_c;
  char c_local;
  int cclass_local;
  
  switch(cclass) {
  case 0x41:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 0x400) == 0);
    break;
  default:
    uStack_c = 0;
    break;
  case 0x43:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 2) == 0);
    break;
  case 0x44:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 0x800) == 0);
    break;
  case 0x50:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 4) == 0);
    break;
  case 0x53:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 0x2000) == 0);
    break;
  case 0x57:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 8) == 0 && c != '_');
    break;
  case 0x58:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 0x1000) == 0);
    break;
  case 0x61:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 0x400) != 0);
    break;
  case 99:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 2) != 0);
    break;
  case 100:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 0x800) != 0);
    break;
  case 0x6c:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 0x200) != 0);
    break;
  case 0x70:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 4) != 0);
    break;
  case 0x73:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 0x2000) != 0);
    break;
  case 0x75:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 0x100) != 0);
    break;
  case 0x77:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 8) != 0 || c == '_');
    break;
  case 0x78:
    ppuVar1 = __ctype_b_loc();
    uStack_c = (uint)(((*ppuVar1)[(int)c] & 0x1000) != 0);
  }
  return uStack_c;
}

Assistant:

static TRexBool trex_matchcclass(int cclass, TRexChar c) {
    switch (cclass) {
        case 'a':
            return isalpha(c) ? TRex_True : TRex_False;
        case 'A':
            return !isalpha(c) ? TRex_True : TRex_False;
        case 'w':
            return (isalnum(c) || c == '_') ? TRex_True : TRex_False;
        case 'W':
            return (!isalnum(c) && c != '_') ? TRex_True : TRex_False;
        case 's':
            return isspace(c) ? TRex_True : TRex_False;
        case 'S':
            return !isspace(c) ? TRex_True : TRex_False;
        case 'd':
            return isdigit(c) ? TRex_True : TRex_False;
        case 'D':
            return !isdigit(c) ? TRex_True : TRex_False;
        case 'x':
            return isxdigit(c) ? TRex_True : TRex_False;
        case 'X':
            return !isxdigit(c) ? TRex_True : TRex_False;
        case 'c':
            return iscntrl(c) ? TRex_True : TRex_False;
        case 'C':
            return !iscntrl(c) ? TRex_True : TRex_False;
        case 'p':
            return ispunct(c) ? TRex_True : TRex_False;
        case 'P':
            return !ispunct(c) ? TRex_True : TRex_False;
        case 'l':
            return islower(c) ? TRex_True : TRex_False;
        case 'u':
            return isupper(c) ? TRex_True : TRex_False;
    }
    return TRex_False; /*cannot happen*/
}